

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::Segment::~Segment(Segment *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  undefined8 *puVar5;
  long in_RDI;
  Cluster *p;
  Cluster **j;
  Cluster **i;
  long count;
  SegmentInfo *in_stack_ffffffffffffffa0;
  SeekHead *this_00;
  Tracks *in_stack_ffffffffffffffb0;
  Chapters *this_01;
  Cluster *in_stack_ffffffffffffffc0;
  Cluster *this_02;
  undefined8 *local_18;
  
  lVar1 = *(long *)(in_RDI + 0xb0);
  lVar2 = *(long *)(in_RDI + 0xb8);
  lVar3 = *(long *)(in_RDI + 0xa8);
  local_18 = *(undefined8 **)(in_RDI + 0xa8);
  while (local_18 != (undefined8 *)(lVar3 + (lVar1 + lVar2) * 8)) {
    puVar5 = local_18 + 1;
    pvVar4 = (void *)*local_18;
    local_18 = puVar5;
    if (pvVar4 != (void *)0x0) {
      Cluster::~Cluster(in_stack_ffffffffffffffc0);
      operator_delete(pvVar4);
    }
  }
  this_02 = *(Cluster **)(in_RDI + 0xa8);
  if (this_02 != (Cluster *)0x0) {
    operator_delete__(this_02);
  }
  pvVar4 = *(void **)(in_RDI + 0x88);
  if (pvVar4 != (void *)0x0) {
    Tracks::~Tracks(in_stack_ffffffffffffffb0);
    operator_delete(pvVar4);
  }
  this_01 = *(Chapters **)(in_RDI + 0x80);
  if (this_01 != (Chapters *)0x0) {
    SegmentInfo::~SegmentInfo(in_stack_ffffffffffffffa0);
    operator_delete(this_01);
  }
  pvVar4 = *(void **)(in_RDI + 0x90);
  if (pvVar4 != (void *)0x0) {
    Cues::~Cues((Cues *)this_02);
    operator_delete(pvVar4);
  }
  this_00 = *(SeekHead **)(in_RDI + 0x98);
  if (this_00 != (SeekHead *)0x0) {
    Chapters::~Chapters(this_01);
    operator_delete(this_00);
  }
  pvVar4 = *(void **)(in_RDI + 0xa0);
  if (pvVar4 != (void *)0x0) {
    Tags::~Tags((Tags *)this_01);
    operator_delete(pvVar4);
  }
  pvVar4 = *(void **)(in_RDI + 0x78);
  if (pvVar4 != (void *)0x0) {
    SeekHead::~SeekHead(this_00);
    operator_delete(pvVar4);
  }
  Cluster::~Cluster(this_02);
  return;
}

Assistant:

Segment::~Segment() {
  const long count = m_clusterCount + m_clusterPreloadCount;

  Cluster** i = m_clusters;
  Cluster** j = m_clusters + count;

  while (i != j) {
    Cluster* const p = *i++;
    delete p;
  }

  delete[] m_clusters;

  delete m_pTracks;
  delete m_pInfo;
  delete m_pCues;
  delete m_pChapters;
  delete m_pTags;
  delete m_pSeekHead;
}